

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_manager.cpp
# Opt level: O1

void __thiscall cab_manager::update_cab(cab_manager *this,id_type id,node_type from,node_type to)

{
  map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
  *this_00;
  _Atomic_word *p_Var1;
  pointer pwVar2;
  bool bVar3;
  int iVar4;
  mapped_type *pmVar5;
  vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>> *this_01;
  mapped_type *pmVar6;
  long lVar7;
  __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
  __it;
  cab_manager *this_02;
  __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
  __it_00;
  node_type local_52;
  node_type local_51;
  cab_manager *local_50;
  weak_ptr<cab> local_48;
  id_type local_34;
  
  this_00 = &this->_cabs_at_node;
  local_52 = to;
  local_51 = from;
  local_50 = this;
  local_34 = id;
  pmVar5 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,&local_51);
  __it_00._M_current =
       (pmVar5->super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  pmVar5 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,&local_51);
  pwVar2 = (pmVar5->super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pwVar2 - (long)__it_00._M_current >> 6;
  local_48.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xffffffffffffffcc;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                        ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0>
                          *)&local_48,__it_00);
      __it._M_current = __it_00._M_current;
      this_02 = local_50;
      if (bVar3) goto LAB_0016656e;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                        ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0>
                          *)&local_48,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      this_02 = local_50;
      if (bVar3) goto LAB_0016656e;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                        ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0>
                          *)&local_48,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      this_02 = local_50;
      if (bVar3) goto LAB_0016656e;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                        ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0>
                          *)&local_48,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      this_02 = local_50;
      if (bVar3) goto LAB_0016656e;
      __it_00._M_current = __it_00._M_current + 4;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  this_02 = local_50;
  lVar7 = (long)pwVar2 - (long)__it_00._M_current >> 4;
  if (lVar7 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar7 != 2) {
      __it._M_current = pwVar2;
      if ((lVar7 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::
                  operator()((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0>
                              *)&local_48,__it_00), __it._M_current = __it_00._M_current, bVar3))
      goto LAB_0016656e;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                      ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0> *
                       )&local_48,__it);
    if (bVar3) goto LAB_0016656e;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::$_0>::operator()
                    ((_Iter_pred<cab_manager::update_cab(unsigned_int,node_type,node_type)::__0> *)
                     &local_48,__it_00);
  __it._M_current = pwVar2;
  if (bVar3) {
    __it._M_current = __it_00._M_current;
  }
LAB_0016656e:
  pmVar5 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,&local_51);
  std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::_M_erase
            (pmVar5,(iterator)__it._M_current);
  this_01 = (vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>> *)
            std::
            map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
            ::operator[](this_00,&local_52);
  pmVar6 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_02,&stack0xffffffffffffffcc);
  local_48.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pmVar6->super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (pmVar6->super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_48.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = (local_48.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = (local_48.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_weak_count + 1;
    }
  }
  std::vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>>::
  emplace_back<std::weak_ptr<cab>>(this_01,&local_48);
  if (local_48.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_48.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = (local_48.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_weak_count;
      (local_48.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*(local_48.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

void cab_manager::update_cab(id_type id, node_type from, node_type to)
{
    auto it = std::find_if(_cabs_at_node[from].begin(), _cabs_at_node[from].end(), 
        [&id](const std::weak_ptr<cab>& cab){
            auto shared = cab.lock();
            return shared->id() == id;
    });
    _cabs_at_node[from].erase(it);
    _cabs_at_node[to].push_back(_cabs[id]);
}